

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void nmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  
  uVar4 = 0;
  uVar5 = 0;
  if (0 < ca) {
    uVar5 = (ulong)(uint)ca;
  }
  uVar6 = 0;
  if (0 < cb) {
    uVar6 = (ulong)(uint)cb;
  }
  uVar3 = (ulong)(uint)ra;
  if (ra < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    lVar1 = uVar4 * (long)cb;
    pdVar9 = B;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      C[lVar1 + uVar7] = 0.0;
      dVar10 = 0.0;
      pdVar8 = pdVar9;
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        dVar10 = dVar10 + A[uVar2] * *pdVar8;
        C[lVar1 + uVar7] = dVar10;
        pdVar8 = pdVar8 + cb;
      }
      pdVar9 = pdVar9 + 1;
    }
    A = A + ca;
  }
  return;
}

Assistant:

void nmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * B[j + k * cb];
			}
		}
	}


}